

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int nn_xrep_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrep *self_00;
  nn_xrep *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_xrep *)nn_alloc_(0x1d8);
  if (self_00 == (nn_xrep *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xrep.c"
            ,0x116);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xrep_init(self_00,&nn_xrep_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

static int nn_xrep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrep *self;

    self = nn_alloc (sizeof (struct nn_xrep), "socket (xrep)");
    alloc_assert (self);
    nn_xrep_init (self, &nn_xrep_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}